

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O3

type __thiscall
cm::String::replace<std::basic_string_view<char,std::char_traits<char>>>
          (String *this,size_type pos,size_type count,
          basic_string_view<char,_std::char_traits<char>_> *s,size_type pos2,size_type count2)

{
  type pSVar1;
  const_iterator first;
  ulong uVar2;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  uVar2 = s->_M_len - pos2;
  if (pos2 <= s->_M_len) {
    local_10._M_len = count2;
    if (uVar2 < count2) {
      local_10._M_len = uVar2;
    }
    local_10._M_str = s->_M_str + pos2;
    first = (this->view_)._M_str + pos;
    pSVar1 = replace<std::basic_string_view<char,std::char_traits<char>>&>
                       (this,first,first + count,&local_10);
    return pSVar1;
  }
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",pos2);
}

Assistant:

typename std::enable_if<AsStringView<T>::value, String&>::type replace(
    size_type pos, size_type count, T&& s, size_type pos2,
    size_type count2 = npos)
  {
    string_view v = AsStringView<T>::view(std::forward<T>(s));
    v = v.substr(pos2, count2);
    return replace(pos, count, v);
  }